

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>::
     init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  shared_ptr<sdf_tools::sdf::SdfPiecewisePipe> *this;
  long in_RDX;
  value_and_holder *in_RSI;
  long in_RDI;
  SdfPiecewisePipe *in_stack_ffffffffffffffc8;
  
  if (in_RDX == 0) {
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      this = detail::value_and_holder::holder<std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>
                       (in_RSI);
      detail::value_and_holder::value_ptr<sdf_tools::sdf::SdfPiecewisePipe>(in_RSI);
      std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>::
      shared_ptr<sdf_tools::sdf::SdfPiecewisePipe,void>(this,in_stack_ffffffffffffffc8);
      detail::value_and_holder::set_holder_constructed(in_RSI,true);
    }
  }
  else {
    init_holder_from_existing(in_RSI,in_RDX);
    detail::value_and_holder::set_holder_constructed(in_RSI,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }